

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O0

DThinker * __thiscall
FDecalStretcherAnim::CreateThinker(FDecalStretcherAnim *this,DBaseDecal *actor,side_t *wall)

{
  DDecalStretcher *this_00;
  DDecalStretcher *thinker;
  side_t *wall_local;
  DBaseDecal *actor_local;
  FDecalStretcherAnim *this_local;
  
  this_00 = (DDecalStretcher *)DObject::operator_new((DObject *)0x70,(size_t)actor);
  DDecalStretcher::DDecalStretcher(this_00,actor);
  this_00->TimeToStart = ::level.maptime + *(int *)&(this->super_FDecalAnimator).field_0xc;
  this_00->TimeToStop = this_00->TimeToStart + this->StretchTime;
  if (this->GoalX < 0.0) {
    this_00->GoalX = 0.0;
    this_00->bStretchX = false;
  }
  else {
    this_00->GoalX = this->GoalX;
    this_00->bStretchX = true;
  }
  if (this->GoalY < 0.0) {
    this_00->GoalY = 0.0;
    this_00->bStretchY = false;
  }
  else {
    this_00->GoalY = this->GoalY;
    this_00->bStretchY = true;
  }
  this_00->bStarted = false;
  return (DThinker *)this_00;
}

Assistant:

DThinker *FDecalStretcherAnim::CreateThinker (DBaseDecal *actor, side_t *wall) const
{
	DDecalStretcher *thinker = new DDecalStretcher (actor);

	thinker->TimeToStart = level.maptime + StretchStart;
	thinker->TimeToStop = thinker->TimeToStart + StretchTime;

	if (GoalX >= 0)
	{
		thinker->GoalX = GoalX;
		thinker->bStretchX = true;
	}
	else
	{
		thinker->GoalX = 0;
		thinker->bStretchX = false;
	}
	if (GoalY >= 0)
	{
		thinker->GoalY = GoalY;
		thinker->bStretchY = true;
	}
	else
	{
		thinker->GoalY = 0;
		thinker->bStretchY = false;
	}
	thinker->bStarted = false;
	return thinker;
}